

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O3

uint aom_highbd_sad128x128_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i alVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  long lVar6;
  undefined1 auVar7 [32];
  __m256i sad;
  __m256i local_80 [2];
  
  local_80[0] = (__m256i)ZEXT1632(ZEXT816(0));
  puVar5 = (uint16_t *)((long)src * 2);
  puVar4 = (uint16_t *)((long)ref * 2);
  lVar6 = 0;
  do {
    sad128x1(puVar5,puVar4,(uint16_t *)((long)second_pred * 2 + lVar6),local_80);
    alVar3 = local_80[0];
    lVar6 = lVar6 + 0x100;
    puVar4 = puVar4 + ref_stride;
    puVar5 = puVar5 + src_stride;
  } while ((int)lVar6 != 0x4000);
  local_80[0] = (__m256i)(ZEXT832(0) << 0x20);
  puVar5 = (uint16_t *)((long)(src + (src_stride << 6)) * 2);
  puVar4 = (uint16_t *)((long)(ref + (ref_stride << 6)) * 2);
  lVar6 = 0;
  do {
    sad128x1(puVar5,puVar4,(uint16_t *)(lVar6 + (long)second_pred * 2 + 0x4000),local_80);
    lVar6 = lVar6 + 0x100;
    puVar4 = puVar4 + ref_stride;
    puVar5 = puVar5 + src_stride;
  } while ((int)lVar6 != 0x4000);
  auVar7 = vpsrldq_avx2((undefined1  [32])alVar3,8);
  auVar7 = vpaddd_avx2(auVar7,(undefined1  [32])alVar3);
  auVar1 = vpaddd_avx(auVar7._16_16_,auVar7._0_16_);
  auVar2 = vphaddd_avx(auVar1,auVar1);
  auVar7 = vpsrldq_avx2((undefined1  [32])local_80[0],8);
  auVar7 = vpaddd_avx2(auVar7,(undefined1  [32])local_80[0]);
  auVar1 = vpaddd_avx(auVar7._16_16_,auVar7._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  return auVar1._0_4_;
}

Assistant:

unsigned int aom_highbd_sad128x128_avg_avx2(const uint8_t *src, int src_stride,
                                            const uint8_t *ref, int ref_stride,
                                            const uint8_t *second_pred) {
  unsigned int sum;
  const int left_shift = 6;

  sum = aom_highbd_sad128x64_avg_avx2(src, src_stride, ref, ref_stride,
                                      second_pred);
  src += src_stride << left_shift;
  ref += ref_stride << left_shift;
  second_pred += 128 << left_shift;
  sum += aom_highbd_sad128x64_avg_avx2(src, src_stride, ref, ref_stride,
                                       second_pred);
  return sum;
}